

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<std::__cxx11::string>
          (rpc_server *this,string *key,string *token,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  size_type sVar1;
  undefined8 this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  _Var2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar3;
  unique_lock<std::mutex> lock_1;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  shared_data;
  shared_ptr<rest_rpc::rpc_service::connection> conn;
  unique_lock<std::mutex> lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [32];
  error_code local_70;
  unique_lock<std::mutex> local_60;
  string local_50 [32];
  
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&local_c0,&this->sub_mtx_);
  sVar1 = (this->sub_map_)._M_h._M_element_count;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_c0);
  if (sVar1 != 0) {
    std::__cxx11::string::string(local_50,(string *)data);
    std::make_shared<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::~string(local_50);
    std::unique_lock<std::mutex>::unique_lock(&local_60,&this->sub_mtx_);
    std::operator+(&local_c0,key,token);
    pVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(&(this->sub_map_)._M_h,&local_c0);
    _Var2._M_cur = (__node_type *)
                   pVar3.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                   ._M_cur;
    std::__cxx11::string::~string((string *)&local_c0);
    if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
         )_Var2._M_cur ==
        pVar3.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
       ) {
      local_70._M_cat = asio::system_category();
      local_70._M_value = 0x16;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     "The subscriber of the key: ",key);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     " does not exist.");
      error_callback(this,&local_70,(string_view)local_c0._0_16_);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)local_90);
    }
    else {
      for (; (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
              )_Var2._M_cur !=
             pVar3.second.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
          ; _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt) {
        std::__shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2> *)
                     local_90,(undefined1 *)
                              ((long)&((_Var2._M_cur)->
                                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                                      ._M_storage._M_storage + 0x20));
        this_00 = local_90._0_8_;
        if (((connection *)local_90._0_8_ != (connection *)0x0) &&
           (*(bool *)(local_90._0_8_ + 0x148) == false)) {
          std::operator+(&local_c0,key,token);
          connection::publish((connection *)this_00,&local_c0,(string *)local_a0._0_8_);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }